

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_containers_array.cpp
# Opt level: O1

int main(void)

{
  RGB rgb;
  RGB rgb_00;
  RGB rgb_01;
  RGB rgb_02;
  ostream *poVar1;
  const_reference pvVar2;
  array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  color_rgb_initializer;
  array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  local_28;
  
  local_28.a._M_elems[0].r = 0xff;
  local_28.a._M_elems[0].g = '\0';
  local_28.a._M_elems[0].b = '\0';
  local_28.a._M_elems[1].r = '\0';
  local_28.a._M_elems[1].g = 0xff;
  local_28.a._M_elems[1].b = '\0';
  local_28.a._M_elems[2].r = '\0';
  local_28.a._M_elems[2].g = '\0';
  local_28.a._M_elems[2].b = 0xff;
  poVar1 = operator<<((ostream *)&std::cout,(RGB)0xff);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = operator<<((ostream *)&std::cout,local_28.a._M_elems[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  rgb_02.b = local_28.a._M_elems[2].b;
  rgb_02.r = local_28.a._M_elems[2].r;
  rgb_02.g = local_28.a._M_elems[2].g;
  poVar1 = operator<<((ostream *)&std::cout,rgb_02);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pvVar2 = magic_enum::containers::
           array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
           ::operator[](&local_28,RED);
  rgb.r = pvVar2->r;
  rgb.g = pvVar2->g;
  rgb.b = pvVar2->b;
  poVar1 = operator<<((ostream *)&std::cout,rgb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pvVar2 = magic_enum::containers::
           array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
           ::operator[](&local_28,GREEN);
  rgb_00.r = pvVar2->r;
  rgb_00.g = pvVar2->g;
  rgb_00.b = pvVar2->b;
  poVar1 = operator<<((ostream *)&std::cout,rgb_00);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pvVar2 = magic_enum::containers::
           array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
           ::operator[](&local_28,BLUE);
  rgb_01.r = pvVar2->r;
  rgb_01.g = pvVar2->g;
  rgb_01.b = pvVar2->b;
  poVar1 = operator<<((ostream *)&std::cout,rgb_01);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {

  constexpr magic_enum::containers::array<Color, RGB> color_rgb_initializer {{{{color_max, 0, 0}, {0, color_max, 0}, {0, 0, color_max}}}};

  std::cout << magic_enum::containers::get<0>(color_rgb_initializer) << std::endl; // R=255 G=0 B=0
  std::cout << magic_enum::containers::get<1>(color_rgb_initializer) << std::endl; // R=0 G=255 B=0
  std::cout << magic_enum::containers::get<2>(color_rgb_initializer) << std::endl; // R=0 G=0 B=255

  std::cout << magic_enum::containers::get<Color::RED>(color_rgb_initializer) << std::endl; // R=255 G=0 B=0
  std::cout << magic_enum::containers::get<Color::GREEN>(color_rgb_initializer) << std::endl; // R=0 G=255 B=0
  std::cout << magic_enum::containers::get<Color::BLUE>(color_rgb_initializer) << std::endl; // R=0 G=0 B=255

  return 0;
}